

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::WriteValue<double,unsigned_long>
          (Serializer *this,pair<double,_unsigned_long> *pair)

{
  (*this->_vptr_Serializer[6])();
  (*this->_vptr_Serializer[2])(this,0,"first");
  (*this->_vptr_Serializer[0x1a])(pair->first,this);
  (*this->_vptr_Serializer[3])(this);
  (*this->_vptr_Serializer[2])(this,1,"second");
  (*this->_vptr_Serializer[0x15])(this,pair->second);
  (*this->_vptr_Serializer[3])(this);
  (*this->_vptr_Serializer[7])(this);
  return;
}

Assistant:

void WriteValue(const std::pair<K, V> &pair) {
		OnObjectBegin();
		WriteProperty(0, "first", pair.first);
		WriteProperty(1, "second", pair.second);
		OnObjectEnd();
	}